

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ess_test.cc
# Opt level: O0

int main(void)

{
  test_attach_instances();
  test_create_scaling_configuration();
  test_create_scaling_group();
  test_create_scaling_rule();
  test_create_scheduled_task();
  test_delete_scaling_configuration();
  test_delete_scaling_group();
  test_delete_scaling_rule();
  test_delete_scheduled_task();
  test_describe_scaling_activities();
  test_describe_scaling_configurations();
  test_describe_scaling_groups();
  test_describe_scaling_instances();
  test_describe_scaling_rules();
  test_describe_scheduled_tasks();
  test_detach_instances();
  test_disable_scaling_group();
  test_enable_scaling_group();
  test_execute_scaling_rule();
  test_modify_scaling_group();
  test_modify_scaling_rule();
  test_modify_scheduled_task();
  test_remove_instances();
  return 0;
}

Assistant:

int main() {
  test_attach_instances();
  test_create_scaling_configuration();
  test_create_scaling_group();
  test_create_scaling_rule();
  test_create_scheduled_task();
  test_delete_scaling_configuration();
  test_delete_scaling_group();
  test_delete_scaling_rule();
  test_delete_scheduled_task();
  test_describe_scaling_activities();
  test_describe_scaling_configurations();
  test_describe_scaling_groups();
  test_describe_scaling_instances();
  test_describe_scaling_rules();
  test_describe_scheduled_tasks();
  test_detach_instances();
  test_disable_scaling_group();
  test_enable_scaling_group();
  test_execute_scaling_rule();
  test_modify_scaling_group();
  test_modify_scaling_rule();
  test_modify_scheduled_task();
  test_remove_instances();
}